

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_diff.cpp
# Opt level: O1

void __thiscall argparse::args_t::parse_file_operation(args_t *this,char *str)

{
  int iVar1;
  
  iVar1 = strcmp(str,"add");
  if (iVar1 == 0) {
    this->op = add;
  }
  else {
    iVar1 = strcmp(str,"replace");
    if (iVar1 == 0) {
      this->op = replace;
    }
    else {
      iVar1 = strcmp(str,"remove");
      if (iVar1 != 0) {
        ERROR("invalid file operation: %s",str);
        return;
      }
      this->op = remove;
    }
  }
  return;
}

Assistant:

void args_t::parse_file_operation( const char * str )
    {
        if (!strcmp (str, "add")) {
            op = add;
        } else if (!strcmp (str, "replace")) {
            op = replace;
        } else if (!strcmp (str, "remove")) {
            op = remove;
        } else  {
            ERROR( "invalid file operation: %s", str );
        }
    }